

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_0::MergeGenericAddendSub
               (uint32_t addend,uint32_t sub,Instruction *inst)

{
  IRContext *this;
  bool bVar1;
  uint32_t uVar2;
  DefUseManager *this_00;
  Instruction *this_01;
  initializer_list<unsigned_int> init_list;
  uint32_t local_ac [3];
  SmallVector<unsigned_int,_2UL> local_a0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  SmallVector<unsigned_int,_2UL> local_58;
  
  this = inst->context_;
  this_00 = IRContext::get_def_use_mgr(this);
  this_01 = analysis::DefUseManager::GetDef(this_00,sub);
  if (((this_01->opcode_ == OpISub) ||
      ((this_01->opcode_ == OpFSub &&
       (bVar1 = Instruction::IsFloatingPointFoldingAllowed(this_01), bVar1)))) &&
     (uVar2 = Instruction::GetSingleWordInOperand(this_01,1), uVar2 == addend)) {
    inst->opcode_ = OpCopyObject;
    local_ac[0] = Instruction::GetSingleWordInOperand(this_01,0);
    init_list._M_len = 1;
    init_list._M_array = local_ac;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
    local_ac[1] = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,&local_58);
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_78,
               local_ac + 1,&local_78);
    Instruction::SetInOperands(inst,(OperandList *)&local_78);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_78)
    ;
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
    IRContext::UpdateDefUse(this,inst);
    return true;
  }
  return false;
}

Assistant:

bool MergeGenericAddendSub(uint32_t addend, uint32_t sub, Instruction* inst) {
  IRContext* context = inst->context();
  analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();
  Instruction* sub_inst = def_use_mgr->GetDef(sub);
  if (sub_inst->opcode() != spv::Op::OpFSub &&
      sub_inst->opcode() != spv::Op::OpISub)
    return false;
  if (sub_inst->opcode() == spv::Op::OpFSub &&
      !sub_inst->IsFloatingPointFoldingAllowed())
    return false;
  if (addend != sub_inst->GetSingleWordInOperand(1)) return false;
  inst->SetOpcode(spv::Op::OpCopyObject);
  inst->SetInOperands(
      {{SPV_OPERAND_TYPE_ID, {sub_inst->GetSingleWordInOperand(0)}}});
  context->UpdateDefUse(inst);
  return true;
}